

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  TestPartResult *pTVar5;
  long *plVar6;
  ostream *poVar7;
  TestInfo *pTVar8;
  size_type *psVar9;
  TimeInMillis ms;
  long lVar10;
  int iVar11;
  int i;
  pointer pcVar12;
  char *pcVar13;
  internal *this;
  string summary;
  string location;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string kTestcase;
  string local_e8;
  string local_c8;
  TestInfo *local_a8;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  TestResult *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"testcase","");
  local_a8 = test_info;
  if (test_info->is_in_another_shard_ != false) goto LAB_001196ba;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,(local_a8->name_)._M_dataplus._M_p,(allocator<char> *)&local_98);
  OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
  paVar2 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pbVar3 = (local_a8->value_param_).ptr_;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"value_param","");
    pbVar3 = (local_a8->value_param_).ptr_;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,pcVar12,(allocator<char> *)&local_98);
    OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar3 = (local_a8->type_param_).ptr_;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type_param","");
    pbVar3 = (local_a8->type_param_).ptr_;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,pcVar12,(allocator<char> *)&local_98);
    OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"file","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,(local_a8->location_).file._M_dataplus._M_p,
               (allocator<char> *)&local_98);
    OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"line","");
    local_98._M_dataplus._M_p._0_4_ = (local_a8->location_).line;
    StreamableToString<int>(&local_e8,(int *)&local_98);
    OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream," />\n",4);
    goto LAB_001196ba;
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"status","");
  pcVar13 = "notrun";
  if ((ulong)local_a8->should_run_ != 0) {
    pcVar13 = "run";
  }
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,pcVar13,pcVar13 + ((ulong)local_a8->should_run_ ^ 1) * 3 + 3);
  OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_e8,(internal *)(local_a8->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"classname","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,test_case_name,(allocator<char> *)&local_98);
  OutputXmlAttribute(stream,&local_58,&local_c8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_38 = &local_a8->result_;
  if ((int)((ulong)((long)(local_a8->result_).test_part_results_.
                          super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_a8->result_).test_part_results_.
                         super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 < 1) {
LAB_00119653:
    if ((int)((ulong)((long)(local_a8->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_a8->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
      goto LAB_00119684;
    }
    lVar10 = 4;
    pcVar13 = " />\n";
  }
  else {
    paVar1 = &local_98.field_2;
    i = 0;
    iVar11 = 0;
    pTVar8 = (TestInfo *)local_38;
    do {
      iVar4 = (int)pTVar8;
      pTVar5 = TestResult::GetTestPartResult(local_38,i);
      if (pTVar5->type_ != kSuccess) {
        if (iVar11 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        this = (internal *)(pTVar5->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar5->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_c8,this,(char *)(ulong)(uint)pTVar5->line_number_,iVar4);
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        std::__cxx11::string::append((char *)&local_98);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_e8.field_2._M_allocated_capacity = *psVar9;
          local_e8.field_2._8_8_ = plVar6[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar9;
          local_e8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_e8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,local_e8._M_dataplus._M_p,&local_99);
        EscapeXml(&local_98,&local_78,true);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" type=\"\">",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_98.field_2._M_allocated_capacity = *psVar9;
          local_98.field_2._8_8_ = plVar6[3];
          local_98._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar9;
          local_98._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_98._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        RemoveInvalidXmlCharacters(&local_78,&local_98);
        OutputXmlCDataSection(stream,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        iVar11 = iVar11 + 1;
      }
      i = i + 1;
      iVar4 = (int)((ulong)((long)(local_a8->result_).test_part_results_.
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_a8->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      pTVar8 = local_a8;
    } while (SBORROW4(i,iVar4 * -0x49249249) != i + iVar4 * 0x49249249 < 0);
    if (iVar11 == 0) goto LAB_00119653;
LAB_00119684:
    OutputXmlTestProperties(stream,local_38);
    lVar10 = 0x10;
    pcVar13 = "    </testcase>\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar13,lVar10);
LAB_001196ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestcase, "file", test_info.file());
    OutputXmlAttribute(stream, kTestcase, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}